

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,AffineSpace3fa *xfm0,AffineSpace3fa *xfm1,
          Ref<embree::SceneGraph::Node> *child)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  unsigned_long *puVar7;
  void *pvVar8;
  long *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v_1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_1;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced_1;
  size_t new_size_alloced;
  void *in_stack_fffffffffffff418;
  Node *in_stack_fffffffffffff420;
  size_t in_stack_fffffffffffff428;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [32];
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  long *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  undefined8 *local_9f8;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  long *local_9d8;
  long *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined1 *local_970;
  undefined1 *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined4 *local_7a0;
  undefined4 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined1 *local_550;
  undefined8 *local_548;
  undefined1 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  undefined1 *local_4f0;
  undefined1 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  ulong local_300;
  ulong local_2f8;
  long local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  undefined8 *local_2c8;
  long local_2c0;
  long local_2b8;
  ulong local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  long local_218;
  long local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  undefined8 *local_178;
  long local_170;
  long local_168;
  ulong local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  long local_c8;
  long local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 *local_68;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  undefined8 *local_40;
  ulong local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  undefined8 *local_10;
  ulong local_8;
  
  local_a38 = in_RCX;
  local_a30 = in_RDX;
  local_a28 = in_RSI;
  Node::Node(in_stack_fffffffffffff420,SUB81((ulong)in_stack_fffffffffffff418 >> 0x38,0));
  *in_RDI = &PTR__TransformNode_00648030;
  local_898 = in_RDI + 0xd;
  local_a10 = &local_ab8;
  local_a18 = local_a28;
  local_a08 = local_a28;
  local_338 = local_a28;
  local_488 = *local_a28;
  uStack_480 = local_a28[1];
  local_ab8 = local_488;
  uStack_ab0 = uStack_480;
  local_340 = &local_aa8;
  local_348 = local_a28 + 2;
  local_468 = *local_348;
  uStack_460 = local_a28[3];
  local_aa8 = local_468;
  uStack_aa0 = uStack_460;
  local_350 = &local_a98;
  local_358 = local_a28 + 4;
  local_448 = *local_358;
  uStack_440 = local_a28[5];
  local_a98 = local_448;
  uStack_a90 = uStack_440;
  local_360 = &local_a88;
  local_368 = local_a28 + 6;
  local_9a8 = *local_368;
  uStack_9a0 = local_a28[7];
  local_a88 = local_9a8;
  uStack_a80 = uStack_9a0;
  local_9c0 = &local_a78;
  local_9c8 = &local_ab8;
  local_a78 = local_488;
  uStack_a70 = uStack_480;
  local_4a0 = &local_a68;
  local_4a8 = &local_aa8;
  local_a68 = local_468;
  uStack_a60 = uStack_460;
  local_4b0 = &local_a58;
  local_4b8 = &local_a98;
  local_a58 = local_448;
  uStack_a50 = uStack_440;
  local_9b0 = &local_a48;
  local_9b8 = &local_a88;
  local_a48 = local_9a8;
  uStack_a40 = uStack_9a0;
  local_9f0 = &local_b48;
  local_9f8 = local_a30;
  local_9e8 = local_a30;
  local_378 = local_a30;
  local_528 = *local_a30;
  uStack_520 = local_a30[1];
  local_380 = &local_b38;
  local_388 = local_a30 + 2;
  local_b38 = *local_388;
  uStack_b30 = local_a30[3];
  local_390 = &local_b28;
  local_398 = local_a30 + 4;
  local_b28 = *local_398;
  uStack_b20 = local_a30[5];
  local_3a0 = &local_b18;
  local_3a8 = local_a30 + 6;
  local_b18 = *local_3a8;
  uStack_b10 = local_a30[7];
  local_980 = &local_b08;
  local_988 = &local_b48;
  local_b08 = local_528;
  uStack_b00 = uStack_520;
  local_540 = local_af8;
  local_548 = &local_b38;
  local_550 = local_ae8;
  local_558 = &local_b28;
  local_970 = local_ad8;
  local_978 = &local_b18;
  local_8a0 = &local_a78;
  local_8a8 = &local_b08;
  local_8ac = 0;
  local_8b0 = 0x3f800000;
  local_798 = &local_8ac;
  local_7a0 = &local_8b0;
  *(undefined4 *)local_898 = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0x3f800000;
  local_890 = in_RDI + 0xe;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  *(undefined1 *)(in_RDI + 0x12) = 0;
  puVar6 = in_RDI + 0xe;
  local_880 = &local_8f8;
  local_8f8 = local_488;
  uStack_8f0 = uStack_480;
  local_3c0 = &local_8e8;
  local_3c8 = &local_a68;
  local_8e8 = local_468;
  uStack_8e0 = uStack_460;
  local_3d0 = &local_8d8;
  local_3d8 = &local_a58;
  local_8d8 = local_448;
  uStack_8d0 = uStack_440;
  local_3e0 = &local_8c8;
  local_3e8 = &local_a48;
  local_8c8 = local_9a8;
  uStack_8c0 = uStack_9a0;
  local_7b8 = &local_8f8;
  local_760 = &local_7f8;
  local_6c8 = &local_7e8;
  local_6d0 = &local_7d8;
  local_678 = &local_7c8;
  local_7f8 = local_488;
  uStack_7f0 = uStack_480;
  local_5c8 = &local_8e8;
  local_5c0 = &local_7e8;
  local_7e8 = local_468;
  uStack_7e0 = uStack_460;
  local_5d8 = &local_8d8;
  local_5d0 = &local_7d8;
  local_7d8 = local_448;
  uStack_7d0 = uStack_440;
  local_758 = &local_8c8;
  local_750 = &local_7c8;
  local_7c8 = local_9a8;
  uStack_7c0 = uStack_9a0;
  local_180 = in_RDI[0xf];
  local_18 = in_RDI[0xf] + 1;
  local_a00 = local_a10;
  local_9e0 = local_9f0;
  local_990 = local_9b0;
  local_950 = local_970;
  local_888 = local_8a0;
  local_878 = local_8a0;
  local_870 = local_880;
  local_7b0 = puVar6;
  local_790 = local_898;
  local_768 = local_7b8;
  local_6f8 = local_760;
  local_6c0 = local_760;
  local_5e8 = local_7b8;
  local_5e0 = local_760;
  local_5b8 = local_7b8;
  local_5b0 = local_760;
  local_568 = local_988;
  local_560 = local_980;
  local_538 = local_988;
  local_530 = local_980;
  local_510 = local_980;
  local_4f0 = local_540;
  local_4d0 = local_550;
  local_4c8 = local_9c8;
  local_4c0 = local_9c0;
  local_498 = local_9c8;
  local_490 = local_9c0;
  local_470 = local_9c0;
  local_450 = local_4a0;
  local_430 = local_4b0;
  local_3b8 = local_8a0;
  local_3b0 = local_880;
  local_370 = local_9f0;
  local_330 = local_a10;
  local_10 = puVar6;
  local_b48 = local_528;
  uStack_b40 = uStack_520;
  if ((ulong)in_RDI[0x10] < local_18) {
    local_8 = local_18;
    if (in_RDI[0x10] != 0) {
      local_20 = in_RDI[0x10];
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar7 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar7;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = in_RDI[0x10];
  }
  local_188 = local_8;
  uVar2 = local_180;
  if (local_180 < (ulong)in_RDI[0xf]) {
    while (local_190 = uVar2, local_190 < (ulong)in_RDI[0xf]) {
      uVar2 = local_190 + 1;
    }
    in_RDI[0xf] = local_180;
  }
  local_178 = puVar6;
  if (local_8 == in_RDI[0x10]) {
    for (local_198 = in_RDI[0xf]; local_198 < local_180; local_198 = local_198 + 1) {
      local_170 = in_RDI[0x11] + local_198 * 0x40;
      local_110 = local_170 + 0x10;
      local_118 = local_170 + 0x20;
      local_c0 = local_170 + 0x30;
      local_120 = local_170;
      local_108 = local_170;
    }
    in_RDI[0xf] = local_180;
  }
  else {
    local_1a0 = in_RDI[0x11];
    local_160 = local_8;
    local_158 = puVar6;
    pvVar8 = alignedMalloc(in_stack_fffffffffffff428,(size_t)in_stack_fffffffffffff420);
    in_RDI[0x11] = pvVar8;
    for (local_1a8 = 0; local_1a8 < (ulong)in_RDI[0xf]; local_1a8 = local_1a8 + 1) {
      local_148 = (undefined8 *)(in_RDI[0x11] + local_1a8 * 0x40);
      local_150 = (undefined8 *)(local_1a0 + local_1a8 * 0x40);
      local_e0 = local_148 + 2;
      local_e8 = local_148 + 4;
      local_d0 = local_148 + 6;
      uVar3 = local_150[1];
      *local_148 = *local_150;
      local_148[1] = uVar3;
      local_98 = local_150 + 2;
      local_90 = local_148 + 2;
      uVar3 = local_150[3];
      *local_90 = *local_98;
      local_148[3] = uVar3;
      local_a8 = local_150 + 4;
      local_a0 = local_148 + 4;
      uVar3 = local_150[5];
      *local_a0 = *local_a8;
      local_148[5] = uVar3;
      local_140 = local_150 + 6;
      local_138 = local_148 + 6;
      uVar3 = local_150[7];
      *local_138 = *local_140;
      local_148[7] = uVar3;
      local_130 = local_148;
      local_d8 = local_148;
      local_b8 = local_150;
      local_b0 = local_148;
      local_88 = local_150;
      local_80 = local_148;
    }
    for (local_1b0 = in_RDI[0xf]; local_1b0 < local_180; local_1b0 = local_1b0 + 1) {
      local_168 = in_RDI[0x11] + local_1b0 * 0x40;
      local_f8 = local_168 + 0x10;
      local_100 = local_168 + 0x20;
      local_c8 = local_168 + 0x30;
      local_128 = local_168;
      local_f0 = local_168;
    }
    local_78 = in_RDI[0x10];
    local_70 = local_1a0;
    local_68 = puVar6;
    alignedFree(in_stack_fffffffffffff418);
    in_RDI[0xf] = local_180;
    in_RDI[0x10] = local_188;
  }
  lVar1 = in_RDI[0xf];
  in_RDI[0xf] = lVar1 + 1;
  local_780 = (undefined8 *)(in_RDI[0x11] + lVar1 * 0x40);
  local_788 = &local_7f8;
  local_6e0 = local_780 + 2;
  local_6e8 = local_780 + 4;
  local_670 = local_780 + 6;
  *local_780 = local_7f8;
  local_780[1] = uStack_7f0;
  local_588 = &local_7e8;
  local_580 = local_780 + 2;
  *local_580 = local_7e8;
  local_780[3] = uStack_7e0;
  local_598 = &local_7d8;
  local_590 = local_780 + 4;
  *local_590 = local_7d8;
  local_780[5] = uStack_7d0;
  local_778 = &local_7c8;
  local_770 = local_780 + 6;
  *local_770 = local_7c8;
  local_780[7] = uStack_7c0;
  puVar6 = in_RDI + 0xe;
  local_860 = &local_948;
  local_868 = local_8a8;
  local_858 = local_8a8;
  local_3f8 = local_8a8;
  local_848 = *local_8a8;
  uStack_840 = local_8a8[1];
  local_948 = local_848;
  uStack_940 = uStack_840;
  local_400 = &local_938;
  local_408 = local_8a8 + 2;
  local_838 = *local_408;
  uStack_830 = local_8a8[3];
  local_938 = local_838;
  uStack_930 = uStack_830;
  local_410 = &local_928;
  local_418 = local_8a8 + 4;
  local_828 = *local_418;
  uStack_820 = local_8a8[5];
  local_928 = local_828;
  uStack_920 = uStack_820;
  local_420 = &local_918;
  local_428 = local_8a8 + 6;
  uVar3 = *local_428;
  uVar4 = local_8a8[7];
  local_808 = &local_948;
  local_720 = &local_848;
  local_698 = &local_838;
  local_6a0 = &local_828;
  local_688 = &local_818;
  local_648 = &local_938;
  local_640 = &local_838;
  local_658 = &local_928;
  local_650 = &local_828;
  local_718 = &local_918;
  local_710 = &local_818;
  local_818 = local_918;
  uStack_810 = uStack_910;
  uVar2 = in_RDI[0xf];
  local_48 = in_RDI[0xf] + 1;
  local_850 = local_860;
  local_800 = puVar6;
  local_728 = local_808;
  local_708 = local_720;
  local_6f0 = local_780;
  local_6d8 = local_780;
  local_690 = local_720;
  local_668 = local_808;
  local_660 = local_720;
  local_638 = local_808;
  local_630 = local_720;
  local_5a8 = local_788;
  local_5a0 = local_780;
  local_578 = local_788;
  local_570 = local_780;
  local_3f0 = local_860;
  local_40 = puVar6;
  local_918 = uVar3;
  uStack_910 = uVar4;
  if ((ulong)in_RDI[0x10] < local_48) {
    local_38 = local_48;
    if (in_RDI[0x10] != 0) {
      local_50 = in_RDI[0x10];
      while (local_50 < local_48) {
        local_60[1] = 1;
        local_60[0] = local_50 << 1;
        puVar7 = std::max<unsigned_long>(local_60 + 1,local_60);
        local_50 = *puVar7;
      }
      local_38 = local_50;
    }
  }
  else {
    local_38 = in_RDI[0x10];
  }
  local_2d8 = local_38;
  uVar5 = uVar2;
  if (uVar2 < (ulong)in_RDI[0xf]) {
    while (local_2e0 = uVar5, local_2e0 < (ulong)in_RDI[0xf]) {
      uVar5 = local_2e0 + 1;
    }
    in_RDI[0xf] = uVar2;
  }
  local_2d0 = uVar2;
  local_2c8 = puVar6;
  if (local_38 == in_RDI[0x10]) {
    for (local_2e8 = in_RDI[0xf]; local_2e8 < uVar2; local_2e8 = local_2e8 + 1) {
      local_2c0 = in_RDI[0x11] + local_2e8 * 0x40;
      local_260 = local_2c0 + 0x10;
      local_268 = local_2c0 + 0x20;
      local_210 = local_2c0 + 0x30;
      local_270 = local_2c0;
      local_258 = local_2c0;
    }
    in_RDI[0xf] = uVar2;
  }
  else {
    local_2f0 = in_RDI[0x11];
    local_2b0 = local_38;
    local_2a8 = puVar6;
    pvVar8 = alignedMalloc(in_stack_fffffffffffff428,(size_t)in_stack_fffffffffffff420);
    in_RDI[0x11] = pvVar8;
    for (local_2f8 = 0; local_2f8 < (ulong)in_RDI[0xf]; local_2f8 = local_2f8 + 1) {
      local_298 = (undefined8 *)(in_RDI[0x11] + local_2f8 * 0x40);
      local_2a0 = (undefined8 *)(local_2f0 + local_2f8 * 0x40);
      local_230 = local_298 + 2;
      local_238 = local_298 + 4;
      local_220 = local_298 + 6;
      uVar3 = local_2a0[1];
      *local_298 = *local_2a0;
      local_298[1] = uVar3;
      local_1e8 = local_2a0 + 2;
      local_1e0 = local_298 + 2;
      uVar3 = local_2a0[3];
      *local_1e0 = *local_1e8;
      local_298[3] = uVar3;
      local_1f8 = local_2a0 + 4;
      local_1f0 = local_298 + 4;
      uVar3 = local_2a0[5];
      *local_1f0 = *local_1f8;
      local_298[5] = uVar3;
      local_290 = local_2a0 + 6;
      local_288 = local_298 + 6;
      uVar3 = local_2a0[7];
      *local_288 = *local_290;
      local_298[7] = uVar3;
      local_280 = local_298;
      local_228 = local_298;
      local_208 = local_2a0;
      local_200 = local_298;
      local_1d8 = local_2a0;
      local_1d0 = local_298;
    }
    for (local_300 = in_RDI[0xf]; local_300 < local_2d0; local_300 = local_300 + 1) {
      local_2b8 = in_RDI[0x11] + local_300 * 0x40;
      local_248 = local_2b8 + 0x10;
      local_250 = local_2b8 + 0x20;
      local_218 = local_2b8 + 0x30;
      local_278 = local_2b8;
      local_240 = local_2b8;
    }
    local_1c8 = in_RDI[0x10];
    local_1c0 = local_2f0;
    local_1b8 = puVar6;
    alignedFree(in_stack_fffffffffffff418);
    in_RDI[0xf] = local_2d0;
    in_RDI[0x10] = local_2d8;
  }
  lVar1 = in_RDI[0xf];
  in_RDI[0xf] = lVar1 + 1;
  local_740 = (undefined8 *)(in_RDI[0x11] + lVar1 * 0x40);
  local_748 = &local_848;
  local_6b0 = local_740 + 2;
  local_6b8 = local_740 + 4;
  local_680 = local_740 + 6;
  *local_740 = local_848;
  local_740[1] = uStack_840;
  local_608 = &local_838;
  local_600 = local_740 + 2;
  *local_600 = local_838;
  local_740[3] = uStack_830;
  local_618 = &local_828;
  local_610 = local_740 + 4;
  *local_610 = local_828;
  local_740[5] = uStack_820;
  local_738 = &local_818;
  local_730 = local_740 + 6;
  *(undefined4 *)local_730 = (undefined4)local_818;
  *(undefined4 *)((long)local_740 + 0x34) = local_818._4_4_;
  *(undefined4 *)(local_740 + 7) = (undefined4)uStack_810;
  *(undefined4 *)((long)local_740 + 0x3c) = uStack_810._4_4_;
  local_9d0 = in_RDI + 0x13;
  local_9d8 = local_a38;
  *local_9d0 = *local_a38;
  if (*local_9d0 != 0) {
    local_700 = local_740;
    local_6a8 = local_740;
    local_628 = local_748;
    local_620 = local_740;
    local_5f8 = local_748;
    local_5f0 = local_740;
    (**(code **)(*(long *)*local_9d0 + 0x10))();
  }
  return;
}

Assistant:

TransformNode (const AffineSpace3fa& xfm0, const AffineSpace3fa& xfm1, const Ref<Node>& child)
        : spaces((AffineSpace3ff)xfm0,(AffineSpace3ff)xfm1), child(child) {}